

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Concat.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeConcat(ConvertLayerParameters layerParameters)

{
  Rep *pRVar1;
  string *psVar2;
  int iVar3;
  Type *pTVar4;
  void **ppvVar5;
  ConcatParameter *pCVar6;
  long lVar7;
  long in_stack_00000008;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  int *in_stack_00000048;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  NeuralNetworkLayer *local_78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  local_78 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                       (in_stack_00000018);
  iVar3 = (pTVar4->bottom_).super_RepeatedPtrFieldBase.current_size_;
  if ((iVar3 < 2) || ((pTVar4->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    std::__cxx11::string::string
              ((string *)&local_d8,"Must have more than 1 input and exactly 1 output",
               (allocator *)&local_b8);
    errorInCaffeProto(&local_d8,(pTVar4->name_).ptr_,(pTVar4->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_d8);
    iVar3 = (pTVar4->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  local_70 = in_stack_00000028;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar1 = (pTVar4->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  for (lVar7 = 0; (long)iVar3 * 8 != lVar7; lVar7 = lVar7 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_48,*(value_type **)((long)ppvVar5 + lVar7));
  }
  pRVar1 = (pTVar4->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  iVar3 = (pTVar4->top_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar7 = 0; (long)iVar3 * 8 != lVar7; lVar7 = lVar7 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_98,*(value_type **)((long)ppvVar5 + lVar7));
  }
  convertCaffeMetadata((pTVar4->name_).ptr_,&local_48,&local_98,in_stack_00000018,local_70);
  pCVar6 = pTVar4->concat_param_;
  if (pCVar6 == (ConcatParameter *)0x0) {
    pCVar6 = (ConcatParameter *)&caffe::_ConcatParameter_default_instance_;
  }
  if (pCVar6->concat_dim_ != 1) {
    std::__cxx11::string::string((string *)&local_d8,"concat_dim",&local_d9);
    psVar2 = (pTVar4->name_).ptr_;
    std::__cxx11::string::string((string *)&local_b8,"Recurrent",&local_da);
    std::__cxx11::to_string(&local_68,pCVar6->axis_);
    unsupportedCaffeParrameterWithOption(&local_d8,psVar2,&local_b8,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  if (pCVar6->axis_ != 1) {
    std::__cxx11::string::string((string *)&local_d8,"axis",&local_d9);
    psVar2 = (pTVar4->name_).ptr_;
    std::__cxx11::string::string((string *)&local_b8,"Recurrent",&local_da);
    std::__cxx11::to_string(&local_68,pCVar6->axis_);
    unsupportedCaffeParrameterWithOption(&local_d8,psVar2,&local_b8,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  CoreML::Specification::NeuralNetworkLayer::mutable_concat(local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeConcat(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() <= 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have more than 1 input and exactly 1 output",caffeLayer.name(),caffeLayer.type());
    }
    
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::ConcatParameter& caffeLayerParams = caffeLayer.concat_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.concat_dim() != 1) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("concat_dim", caffeLayer.name(), "Recurrent",
                                                           std::to_string(caffeLayerParams.axis()));

    }
    if (caffeLayerParams.axis() != 1) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(), "Recurrent",
                                        std::to_string(caffeLayerParams.axis()));
    }
    //**************************************************************

    
    (void) specLayer->mutable_concat();
}